

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NNValidatorTests.cpp
# Opt level: O1

int testRNNLayer2(void)

{
  pointer pcVar1;
  int iVar2;
  ConvolutionLayerParams *pCVar3;
  Rep *pRVar4;
  long lVar5;
  bool bVar6;
  ModelDescription *pMVar7;
  Type *pTVar8;
  FeatureType *pFVar9;
  ArrayFeatureType *pAVar10;
  TypeUnion this;
  Type *this_00;
  SimpleRecurrentLayerParams *this_01;
  ActivationParams *pAVar11;
  ActivationSigmoid *this_02;
  WeightParams *pWVar12;
  ostream *poVar13;
  Result res;
  Model m1;
  undefined1 local_78 [24];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_60;
  Model local_50;
  
  CoreML::Specification::Model::Model(&local_50);
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    local_50.description_ = pMVar7;
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->input_).super_RepeatedPtrFieldBase,(Type *)0x0);
  pcVar1 = local_78 + 0x10;
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"input","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar8->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (pTVar8->type_ == (FeatureType *)0x0) {
    pFVar9 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar9);
    pTVar8->type_ = pFVar9;
  }
  pFVar9 = pTVar8->type_;
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  if (pTVar8->type_ == (FeatureType *)0x0) {
    pFVar9 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar9);
    pTVar8->type_ = pFVar9;
  }
  pFVar9 = pTVar8->type_;
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  pAVar10 = (pFVar9->Type_).multiarraytype_;
  iVar2 = (pAVar10->shape_).total_size_;
  if ((pAVar10->shape_).current_size_ == iVar2) {
    google::protobuf::RepeatedField<long>::Reserve(&pAVar10->shape_,iVar2 + 1);
  }
  iVar2 = (pAVar10->shape_).current_size_;
  (pAVar10->shape_).current_size_ = iVar2 + 1;
  ((pAVar10->shape_).rep_)->elements[iVar2] = 1;
  if (local_50.description_ == (ModelDescription *)0x0) {
    pMVar7 = (ModelDescription *)operator_new(0x78);
    CoreML::Specification::ModelDescription::ModelDescription(pMVar7);
    local_50.description_ = pMVar7;
  }
  pTVar8 = google::protobuf::internal::RepeatedPtrFieldBase::
           Add<google::protobuf::RepeatedPtrField<CoreML::Specification::FeatureDescription>::TypeHandler>
                     (&((local_50.description_)->output_).super_RepeatedPtrFieldBase,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"output","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&pTVar8->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  if (pTVar8->type_ == (FeatureType *)0x0) {
    pFVar9 = (FeatureType *)operator_new(0x28);
    CoreML::Specification::FeatureType::FeatureType(pFVar9);
    pTVar8->type_ = pFVar9;
  }
  pFVar9 = pTVar8->type_;
  if (pFVar9->_oneof_case_[0] != 5) {
    CoreML::Specification::FeatureType::clear_Type(pFVar9);
    pFVar9->_oneof_case_[0] = 5;
    pAVar10 = (ArrayFeatureType *)operator_new(0x48);
    CoreML::Specification::ArrayFeatureType::ArrayFeatureType(pAVar10);
    (pFVar9->Type_).multiarraytype_ = pAVar10;
  }
  if (local_50._oneof_case_[0] != 500) {
    CoreML::Specification::Model::clear_Type(&local_50);
    local_50._oneof_case_[0] = 500;
    this.pipelineclassifier_ = (PipelineClassifier *)operator_new(0x58);
    CoreML::Specification::NeuralNetwork::NeuralNetwork(this.neuralnetwork_);
    local_50.Type_.pipelineclassifier_ = this.pipelineclassifier_;
  }
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      ((RepeatedPtrFieldBase *)&(local_50.Type_.pipeline_)->models_,(Type *)0x0);
  local_78._0_8_ = pcVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_78,"rnn","");
  google::protobuf::internal::ArenaStringPtr::SetNoArena
            (&this_00->name_,
             (string *)&google::protobuf::internal::fixed_address_empty_string_abi_cxx11_,
             (string *)local_78);
  if ((pointer)local_78._0_8_ != pcVar1) {
    operator_delete((void *)local_78._0_8_,local_78._16_8_ + 1);
  }
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"input");
  CoreML::Specification::NeuralNetworkLayer::add_input(this_00,"hin");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"output");
  CoreML::Specification::NeuralNetworkLayer::add_output(this_00,"hout");
  if (this_00->_oneof_case_[0] != 400) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 400;
    this_01 = (SimpleRecurrentLayerParams *)operator_new(0x48);
    CoreML::Specification::SimpleRecurrentLayerParams::SimpleRecurrentLayerParams(this_01);
    (this_00->layer_).simplerecurrent_ = this_01;
  }
  pCVar3 = (this_00->layer_).convolution_;
  *(undefined2 *)&(pCVar3->dilationfactor_).current_size_ = 0;
  (pCVar3->stride_).rep_ = (Rep *)0x1;
  *(undefined8 *)&pCVar3->_stride_cached_byte_size_ = 2;
  lVar5._0_4_ = (pCVar3->kernelsize_).current_size_;
  lVar5._4_4_ = (pCVar3->kernelsize_).total_size_;
  if (lVar5 == 0) {
    pAVar11 = (ActivationParams *)operator_new(0x20);
    CoreML::Specification::ActivationParams::ActivationParams(pAVar11);
    *(ActivationParams **)&pCVar3->kernelsize_ = pAVar11;
  }
  pAVar11 = *(ActivationParams **)&pCVar3->kernelsize_;
  if (pAVar11->_oneof_case_[0] != 0x28) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pAVar11);
    pAVar11->_oneof_case_[0] = 0x28;
    this_02 = (ActivationSigmoid *)operator_new(0x18);
    CoreML::Specification::ActivationSigmoid::ActivationSigmoid(this_02);
    (pAVar11->NonlinearityType_).sigmoid_ = this_02;
  }
  if ((pCVar3->kernelsize_).rep_ == (Rep *)0x0) {
    pWVar12 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar12);
    (pCVar3->kernelsize_).rep_ = (Rep *)pWVar12;
  }
  pRVar4 = (pCVar3->kernelsize_).rep_;
  iVar2 = *(int *)((long)&pRVar4[1].arena + 4);
  if (*(int *)&pRVar4[1].arena == iVar2) {
    google::protobuf::RepeatedField<float>::Reserve((RepeatedField<float> *)(pRVar4 + 1),iVar2 + 1);
  }
  iVar2 = *(int *)&pRVar4[1].arena;
  *(int *)&pRVar4[1].arena = iVar2 + 1;
  *(undefined4 *)(pRVar4[1].elements[0] + 8 + (long)iVar2 * 4) = 0x3f800000;
  if ((pCVar3->kernelsize_).rep_ == (Rep *)0x0) {
    pWVar12 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar12);
    (pCVar3->kernelsize_).rep_ = (Rep *)pWVar12;
  }
  pRVar4 = (pCVar3->kernelsize_).rep_;
  iVar2 = *(int *)((long)&pRVar4[1].arena + 4);
  if (*(int *)&pRVar4[1].arena == iVar2) {
    google::protobuf::RepeatedField<float>::Reserve((RepeatedField<float> *)(pRVar4 + 1),iVar2 + 1);
  }
  iVar2 = *(int *)&pRVar4[1].arena;
  *(int *)&pRVar4[1].arena = iVar2 + 1;
  *(undefined4 *)(pRVar4[1].elements[0] + 8 + (long)iVar2 * 4) = 0x3f800000;
  if (*(long *)&pCVar3->_kernelsize_cached_byte_size_ == 0) {
    pWVar12 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar12);
    *(WeightParams **)&pCVar3->_kernelsize_cached_byte_size_ = pWVar12;
  }
  lVar5 = *(long *)&pCVar3->_kernelsize_cached_byte_size_;
  if (*(int *)(lVar5 + 0x10) == *(int *)(lVar5 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve
              ((RepeatedField<float> *)(lVar5 + 0x10),*(int *)(lVar5 + 0x14) + 1);
  }
  iVar2 = *(int *)(lVar5 + 0x10);
  *(int *)(lVar5 + 0x10) = iVar2 + 1;
  *(undefined4 *)(*(long *)(lVar5 + 0x18) + 8 + (long)iVar2 * 4) = 0x3f800000;
  if (*(long *)&pCVar3->_kernelsize_cached_byte_size_ == 0) {
    pWVar12 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar12);
    *(WeightParams **)&pCVar3->_kernelsize_cached_byte_size_ = pWVar12;
  }
  lVar5 = *(long *)&pCVar3->_kernelsize_cached_byte_size_;
  if (*(int *)(lVar5 + 0x10) == *(int *)(lVar5 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve
              ((RepeatedField<float> *)(lVar5 + 0x10),*(int *)(lVar5 + 0x14) + 1);
  }
  iVar2 = *(int *)(lVar5 + 0x10);
  *(int *)(lVar5 + 0x10) = iVar2 + 1;
  *(undefined4 *)(*(long *)(lVar5 + 0x18) + 8 + (long)iVar2 * 4) = 0x3f800000;
  if (*(long *)&pCVar3->_kernelsize_cached_byte_size_ == 0) {
    pWVar12 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar12);
    *(WeightParams **)&pCVar3->_kernelsize_cached_byte_size_ = pWVar12;
  }
  lVar5 = *(long *)&pCVar3->_kernelsize_cached_byte_size_;
  if (*(int *)(lVar5 + 0x10) == *(int *)(lVar5 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve
              ((RepeatedField<float> *)(lVar5 + 0x10),*(int *)(lVar5 + 0x14) + 1);
  }
  iVar2 = *(int *)(lVar5 + 0x10);
  *(int *)(lVar5 + 0x10) = iVar2 + 1;
  *(undefined4 *)(*(long *)(lVar5 + 0x18) + 8 + (long)iVar2 * 4) = 0x3f800000;
  if (*(long *)&pCVar3->_kernelsize_cached_byte_size_ == 0) {
    pWVar12 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar12);
    *(WeightParams **)&pCVar3->_kernelsize_cached_byte_size_ = pWVar12;
  }
  lVar5 = *(long *)&pCVar3->_kernelsize_cached_byte_size_;
  if (*(int *)(lVar5 + 0x10) == *(int *)(lVar5 + 0x14)) {
    google::protobuf::RepeatedField<float>::Reserve
              ((RepeatedField<float> *)(lVar5 + 0x10),*(int *)(lVar5 + 0x14) + 1);
  }
  iVar2 = *(int *)(lVar5 + 0x10);
  *(int *)(lVar5 + 0x10) = iVar2 + 1;
  *(undefined4 *)(*(long *)(lVar5 + 0x18) + 8 + (long)iVar2 * 4) = 0x3f800000;
  CoreML::validate<(MLModelType)500>((Result *)local_78,&local_50);
  bVar6 = CoreML::Result::good((Result *)local_78);
  if (bVar6) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/mlmodel/tests/NNValidatorTests.cpp"
               ,0x6c);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,":",1);
    poVar13 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,0x344);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,": error: ",9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13,"!((res).good())",0xf);
    std::__ostream_insert<char,std::char_traits<char>>(poVar13," was false, expected true.",0x1a);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar13 + -0x18) + (char)poVar13);
    std::ostream::put((char)poVar13);
    std::ostream::flush();
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_78._8_8_ != &local_60) {
    operator_delete((void *)local_78._8_8_,local_60._0_8_ + 1);
  }
  CoreML::Specification::Model::~Model(&local_50);
  return (uint)bVar6;
}

Assistant:

int testRNNLayer2() {

    Specification::Model m1;

    // recurrent layers don't appear in the interface
    auto *topIn = m1.mutable_description()->add_input();
    topIn->set_name("input");
    topIn->mutable_type()->mutable_multiarraytype();
    auto *shape = topIn->mutable_type()->mutable_multiarraytype();
    shape->add_shape(1);

    auto *out = m1.mutable_description()->add_output();
    out->set_name("output");
    out->mutable_type()->mutable_multiarraytype();

    auto *nn = m1.mutable_neuralnetwork();
    Specification::NeuralNetworkLayer *layer = nn->add_layers();
    layer->set_name("rnn");
    layer->add_input("input");
    layer->add_input("hin");

    layer->add_output("output");
    layer->add_output("hout");

    Specification::SimpleRecurrentLayerParams *params = layer->mutable_simplerecurrent();
    params->set_hasbiasvector(false);
    params->set_sequenceoutput(false);
    params->set_inputvectorsize(1);
    params->set_outputvectorsize(2);
    params->mutable_activation()->mutable_sigmoid();

    params->mutable_weightmatrix()->add_floatvalue(1.0);
    params->mutable_weightmatrix()->add_floatvalue(1.0);

    params->mutable_recursionmatrix()->add_floatvalue(1.0);
    params->mutable_recursionmatrix()->add_floatvalue(1.0);
    params->mutable_recursionmatrix()->add_floatvalue(1.0);
    params->mutable_recursionmatrix()->add_floatvalue(1.0);

    Result res = validate<MLModelType_neuralNetwork>(m1);
    ML_ASSERT_BAD(res);

    return 0;

}